

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val.hpp
# Opt level: O0

Up __thiscall
yactfr::internal::
JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
::_clone(JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
         *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  JsonVal *in_RSI;
  unique_ptr<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_std::default_delete<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>_>_>
  local_20 [2];
  JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
  *this_local;
  
  this_local = this;
  __args_1 = ScalarValItemMixin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::_val((ScalarValItemMixin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(in_RSI + 1));
  JsonVal::loc(in_RSI);
  std::
  make_unique<yactfr::internal::JsonScalarVal<std::__cxx11::string,(yactfr::internal::JsonValKind)5>const,std::__cxx11::string_const&,yactfr::TextLocation_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
             (TextLocation *)__args_1);
  std::
  unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>::
  unique_ptr<yactfr::internal::JsonScalarVal<std::__cxx11::string,(yactfr::internal::JsonValKind)5>const,std::default_delete<yactfr::internal::JsonScalarVal<std::__cxx11::string,(yactfr::internal::JsonValKind)5>const>,void>
            ((unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>
              *)this,local_20);
  std::
  unique_ptr<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_std::default_delete<const_yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>_>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>,_true,_true>
            )this;
}

Assistant:

JsonVal::Up _clone() const override
    {
        return std::make_unique<const JsonScalarVal<ValT, KindV>>(this->_val(), this->loc());
    }